

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UBool uscript_hasScript_63(UChar32 c,UScriptCode sc)

{
  UScriptCode UVar1;
  UScriptCode UVar2;
  ulong uVar3;
  ushort *puStack_20;
  uint32_t scriptX;
  uint16_t *scx;
  UScriptCode sc_local;
  UChar32 c_local;
  
  UVar1 = u_getUnicodeProperties_63(c,0);
  UVar2 = UVar1 & 0xc000ff;
  if ((uint)UVar2 < 0x400000) {
    sc_local._3_1_ = sc == UVar2;
  }
  else {
    uVar3 = (ulong)(uint)(UVar1 & (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_TAI_VIET));
    if (0xbfffff < (uint)UVar2) {
      uVar3 = (ulong)(int)(uint)scriptExtensions[uVar3 + 1];
    }
    puStack_20 = scriptExtensions + uVar3;
    if (sc < USCRIPT_CODE_LIMIT) {
      for (; (int)(uint)*puStack_20 < sc; puStack_20 = puStack_20 + 1) {
      }
      sc_local._3_1_ = sc == ((uint)*puStack_20 & 0x7fff);
    }
    else {
      sc_local._3_1_ = USCRIPT_COMMON >> 0x18;
    }
  }
  return sc_local._3_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uscript_hasScript(UChar32 c, UScriptCode sc) {
    const uint16_t *scx;
    uint32_t scriptX=u_getUnicodeProperties(c, 0)&UPROPS_SCRIPT_X_MASK;
    if(scriptX<UPROPS_SCRIPT_X_WITH_COMMON) {
        return sc==(UScriptCode)scriptX;
    }

    scx=scriptExtensions+(scriptX&UPROPS_SCRIPT_MASK);
    if(scriptX>=UPROPS_SCRIPT_X_WITH_OTHER) {
        scx=scriptExtensions+scx[1];
    }
    if(sc>=USCRIPT_CODE_LIMIT) {
        /* Guard against bogus input that would make us go past the Script_Extensions terminator. */
        return FALSE;
    }
    while(sc>*scx) {
        ++scx;
    }
    return sc==(*scx&0x7fff);
}